

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::prepareExpandedExpression(AssertionResult *result)

{
  long in_FS_OFFSET;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  AssertionResult::getExpandedExpression_abi_cxx11_(&local_30,result);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void prepareExpandedExpression(AssertionResult& result) {
        result.getExpandedExpression();
    }